

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Compare_distr(int g_a,int g_b)

{
  logical lVar1;
  Integer b;
  Integer a;
  logical st;
  Integer in_stack_000003f0;
  Integer in_stack_000003f8;
  uint local_4;
  
  lVar1 = pnga_compare_distr(in_stack_000003f8,in_stack_000003f0);
  local_4 = (uint)(lVar1 != 1);
  return local_4;
}

Assistant:

int NGA_Compare_distr(int g_a, int g_b)
{
    logical st;
    Integer a=(Integer)g_a;
    Integer b=(Integer)g_b;
    st = wnga_compare_distr(a,b);
    if(st == TRUE) return 0;
    else return 1;
}